

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O1

HashTable<1UL> * CalculateInThreads<2ul>(HashTable<1UL> *__return_storage_ptr__,Data *input)

{
  char cVar1;
  Data DVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [11];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  HashTable<1UL> *pHVar22;
  ctrl_t *pcVar23;
  slot_type *psVar24;
  size_t sVar25;
  size_t sVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  char *pcVar30;
  pair<const_Key<2UL>,_unsigned_int> *j;
  slot_type *k;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  thread threads [4];
  HashTable<1UL> hash_tables [4];
  anon_class_16_2_28188355_for__M_head_impl invoke;
  uint local_15c;
  HashTable<1UL> *local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>::iterator,_bool>
  local_120;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  local_108 [4];
  anon_class_16_2_28188355_for__M_head_impl local_40;
  
  lVar27 = 0;
  do {
    *(undefined1 **)((long)&local_108[0].ctrl_ + lVar27) =
         &phmap::priv::
          EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
          ::empty_group;
    *(undefined8 *)
     ((long)&local_108[0].settings_.
             super__Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
             .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + lVar27) = 0;
    *(undefined1 (*) [16])((long)&local_108[0].slots_ + lVar27) = (undefined1  [16])0x0;
    *(undefined8 *)((long)&local_108[0].capacity_ + lVar27) = 0;
    lVar27 = lVar27 + 0x30;
  } while (lVar27 != 0xc0);
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_40.hash_tables = (HashTable<1UL> (*) [4])local_108;
  local_15c = 0;
  local_40.input = input;
  do {
    std::thread::
    thread<CalculateInThreads<2ul>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)::_lambda(unsigned_int)_1_&,unsigned_int&,void>
              ((thread *)&local_120,&local_40,&local_15c);
    if (*(long *)(local_148 + (ulong)local_15c * 8) != 0) goto LAB_00104330;
    *(ctrl_t **)(local_148 + (ulong)local_15c * 8) = local_120.first.ctrl_;
    local_15c = local_15c + 1;
  } while (local_15c < 4);
  lVar27 = 0;
  do {
    std::thread::join();
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x20);
  lVar27 = 1;
  local_158 = __return_storage_ptr__;
  do {
    pcVar3 = local_108[lVar27].ctrl_;
    k = local_108[lVar27].slots_;
    cVar1 = *pcVar3;
    pcVar30 = pcVar3;
    while (cVar1 < -1) {
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar30 < (char)iVar10);
      in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Be = -(pcVar30[4] < (char)iVar11);
      in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bi = -(pcVar30[8] < (char)iVar12);
      in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar13);
      in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar13 >> 0x18));
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar20[1] = in_XMM1_Bd;
      auVar20[0] = in_XMM1_Bc;
      auVar20[2] = in_XMM1_Be;
      auVar20[3] = in_XMM1_Bf;
      auVar20[4] = in_XMM1_Bg;
      auVar20[5] = in_XMM1_Bh;
      auVar20[6] = in_XMM1_Bi;
      auVar20[7] = in_XMM1_Bj;
      auVar20[8] = in_XMM1_Bk;
      auVar20[9] = in_XMM1_Bl;
      auVar20[10] = in_XMM1_Bm;
      auVar20[0xb] = in_XMM1_Bn;
      auVar20[0xc] = in_XMM1_Bo;
      auVar20[0xd] = in_XMM1_Bp;
      auVar18[1] = in_XMM1_Be;
      auVar18[0] = in_XMM1_Bd;
      auVar18[2] = in_XMM1_Bf;
      auVar18[3] = in_XMM1_Bg;
      auVar18[4] = in_XMM1_Bh;
      auVar18[5] = in_XMM1_Bi;
      auVar18[6] = in_XMM1_Bj;
      auVar18[7] = in_XMM1_Bk;
      auVar18[8] = in_XMM1_Bl;
      auVar18[9] = in_XMM1_Bm;
      auVar18[10] = in_XMM1_Bn;
      auVar18[0xb] = in_XMM1_Bo;
      auVar18[0xc] = in_XMM1_Bp;
      auVar16[1] = in_XMM1_Bf;
      auVar16[0] = in_XMM1_Be;
      auVar16[2] = in_XMM1_Bg;
      auVar16[3] = in_XMM1_Bh;
      auVar16[4] = in_XMM1_Bi;
      auVar16[5] = in_XMM1_Bj;
      auVar16[6] = in_XMM1_Bk;
      auVar16[7] = in_XMM1_Bl;
      auVar16[8] = in_XMM1_Bm;
      auVar16[9] = in_XMM1_Bn;
      auVar16[10] = in_XMM1_Bo;
      auVar16[0xb] = in_XMM1_Bp;
      auVar14[1] = in_XMM1_Bg;
      auVar14[0] = in_XMM1_Bf;
      auVar14[2] = in_XMM1_Bh;
      auVar14[3] = in_XMM1_Bi;
      auVar14[4] = in_XMM1_Bj;
      auVar14[5] = in_XMM1_Bk;
      auVar14[6] = in_XMM1_Bl;
      auVar14[7] = in_XMM1_Bm;
      auVar14[8] = in_XMM1_Bn;
      auVar14[9] = in_XMM1_Bo;
      auVar14[10] = in_XMM1_Bp;
      uVar29 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar29 != 0) {
        for (; (uVar29 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar28 = (ulong)uVar5;
      k = (slot_type *)(&k->key + uVar28 * 2);
      cVar1 = pcVar30[uVar28];
      pcVar30 = pcVar30 + uVar28;
    }
    sVar4 = local_108[lVar27].capacity_;
    local_150 = lVar27;
    while (sVar26 = local_108[0].capacity_, sVar25 = local_108[0].size_,
          psVar24 = local_108[0].slots_, pcVar23 = local_108[0].ctrl_, pHVar22 = local_158,
          pcVar30 != pcVar3 + sVar4) {
      DVar2 = (&k->key)[1]._data;
      phmap::priv::
      raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<2ul>,unsigned_int>,Key<2ul>::Hash,phmap::EqualTo<Key<2ul>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>
      ::try_emplace_impl<Key<2ul>const&>(&local_120,local_108,&k->key);
      *(int *)((long)local_120.first.field_1.slot_ + 4) =
           *(int *)((long)local_120.first.field_1.slot_ + 4) + DVar2;
      k = (slot_type *)(&k->key + 2);
      cVar1 = pcVar30[1];
      pcVar30 = pcVar30 + 1;
      while (cVar1 < -1) {
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar30 < (char)iVar10);
        in_XMM1_Bb = -(pcVar30[1] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bc = -(pcVar30[2] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bd = -(pcVar30[3] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Be = -(pcVar30[4] < (char)iVar11);
        in_XMM1_Bf = -(pcVar30[5] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bg = -(pcVar30[6] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bh = -(pcVar30[7] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Bi = -(pcVar30[8] < (char)iVar12);
        in_XMM1_Bj = -(pcVar30[9] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bk = -(pcVar30[10] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bl = -(pcVar30[0xb] < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bm = -(pcVar30[0xc] < (char)iVar13);
        in_XMM1_Bn = -(pcVar30[0xd] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bo = -(pcVar30[0xe] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bp = -(pcVar30[0xf] < (char)((uint)iVar13 >> 0x18));
        auVar8[1] = in_XMM1_Bb;
        auVar8[0] = in_XMM1_Ba;
        auVar8[2] = in_XMM1_Bc;
        auVar8[3] = in_XMM1_Bd;
        auVar8[4] = in_XMM1_Be;
        auVar8[5] = in_XMM1_Bf;
        auVar8[6] = in_XMM1_Bg;
        auVar8[7] = in_XMM1_Bh;
        auVar8[8] = in_XMM1_Bi;
        auVar8[9] = in_XMM1_Bj;
        auVar8[10] = in_XMM1_Bk;
        auVar8[0xb] = in_XMM1_Bl;
        auVar8[0xc] = in_XMM1_Bm;
        auVar8[0xd] = in_XMM1_Bn;
        auVar8[0xe] = in_XMM1_Bo;
        auVar8[0xf] = in_XMM1_Bp;
        auVar9[1] = in_XMM1_Bb;
        auVar9[0] = in_XMM1_Ba;
        auVar9[2] = in_XMM1_Bc;
        auVar9[3] = in_XMM1_Bd;
        auVar9[4] = in_XMM1_Be;
        auVar9[5] = in_XMM1_Bf;
        auVar9[6] = in_XMM1_Bg;
        auVar9[7] = in_XMM1_Bh;
        auVar9[8] = in_XMM1_Bi;
        auVar9[9] = in_XMM1_Bj;
        auVar9[10] = in_XMM1_Bk;
        auVar9[0xb] = in_XMM1_Bl;
        auVar9[0xc] = in_XMM1_Bm;
        auVar9[0xd] = in_XMM1_Bn;
        auVar9[0xe] = in_XMM1_Bo;
        auVar9[0xf] = in_XMM1_Bp;
        auVar21[1] = in_XMM1_Bd;
        auVar21[0] = in_XMM1_Bc;
        auVar21[2] = in_XMM1_Be;
        auVar21[3] = in_XMM1_Bf;
        auVar21[4] = in_XMM1_Bg;
        auVar21[5] = in_XMM1_Bh;
        auVar21[6] = in_XMM1_Bi;
        auVar21[7] = in_XMM1_Bj;
        auVar21[8] = in_XMM1_Bk;
        auVar21[9] = in_XMM1_Bl;
        auVar21[10] = in_XMM1_Bm;
        auVar21[0xb] = in_XMM1_Bn;
        auVar21[0xc] = in_XMM1_Bo;
        auVar21[0xd] = in_XMM1_Bp;
        auVar19[1] = in_XMM1_Be;
        auVar19[0] = in_XMM1_Bd;
        auVar19[2] = in_XMM1_Bf;
        auVar19[3] = in_XMM1_Bg;
        auVar19[4] = in_XMM1_Bh;
        auVar19[5] = in_XMM1_Bi;
        auVar19[6] = in_XMM1_Bj;
        auVar19[7] = in_XMM1_Bk;
        auVar19[8] = in_XMM1_Bl;
        auVar19[9] = in_XMM1_Bm;
        auVar19[10] = in_XMM1_Bn;
        auVar19[0xb] = in_XMM1_Bo;
        auVar19[0xc] = in_XMM1_Bp;
        auVar17[1] = in_XMM1_Bf;
        auVar17[0] = in_XMM1_Be;
        auVar17[2] = in_XMM1_Bg;
        auVar17[3] = in_XMM1_Bh;
        auVar17[4] = in_XMM1_Bi;
        auVar17[5] = in_XMM1_Bj;
        auVar17[6] = in_XMM1_Bk;
        auVar17[7] = in_XMM1_Bl;
        auVar17[8] = in_XMM1_Bm;
        auVar17[9] = in_XMM1_Bn;
        auVar17[10] = in_XMM1_Bo;
        auVar17[0xb] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Bg;
        auVar15[0] = in_XMM1_Bf;
        auVar15[2] = in_XMM1_Bh;
        auVar15[3] = in_XMM1_Bi;
        auVar15[4] = in_XMM1_Bj;
        auVar15[5] = in_XMM1_Bk;
        auVar15[6] = in_XMM1_Bl;
        auVar15[7] = in_XMM1_Bm;
        auVar15[8] = in_XMM1_Bn;
        auVar15[9] = in_XMM1_Bo;
        auVar15[10] = in_XMM1_Bp;
        uVar29 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar5 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        uVar28 = (ulong)uVar5;
        k = (slot_type *)(&k->key + uVar28 * 2);
        cVar1 = pcVar30[uVar28];
        pcVar30 = pcVar30 + uVar28;
      }
    }
    lVar27 = local_150 + 1;
  } while (lVar27 != 4);
  local_108[0].ctrl_ =
       &phmap::priv::
        EmptyGroup<std::is_same<std::allocator<std::pair<Key<2ul>const,unsigned_int>>,std::allocator<std::pair<Key<2ul>const,unsigned_int>>>>()
        ::empty_group;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .ctrl_ = pcVar23;
  local_108[0].slots_ = (slot_type *)0x0;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .slots_ = (slot_type *)psVar24;
  local_108[0].size_ = 0;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .size_ = sVar25;
  local_108[0].capacity_ = 0;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .capacity_ = sVar26;
  (local_158->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<1UL>,_unsigned_int>,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<1UL>::Hash,_phmap::EqualTo<Key<1UL>_>,_std::allocator<std::pair<const_Key<1UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       local_108[0].settings_.
       super__Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
       .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_108[0].settings_.
  super__Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_long,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
        )(_Head_base<0UL,_unsigned_long,_false>)0x0;
  lVar27 = 0x20;
  while (*(long *)(local_148 + lVar27 + -8) == 0) {
    lVar27 = lVar27 + -8;
    if (lVar27 == 0) {
      lVar27 = 0x90;
      do {
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
        ::destroy_slots((raw_hash_set<phmap::priv::FlatHashMapPolicy<Key<2UL>,_unsigned_int>,_Key<2UL>::Hash,_phmap::EqualTo<Key<2UL>_>,_std::allocator<std::pair<const_Key<2UL>,_unsigned_int>_>_>
                         *)((long)&local_108[0].ctrl_ + lVar27));
        lVar27 = lVar27 + -0x30;
      } while (lVar27 != -0x30);
      return pHVar22;
    }
  }
LAB_00104330:
  std::terminate();
}

Assistant:

HashTable<size> CalculateInThreads(const Cfg::Data& input)
{
    HashTable<size> hash_tables[thread_count];
    std::thread threads[thread_count];

    auto invoke = [&](unsigned begin) {
        Calculate<size>(input, begin, hash_tables[begin]);
    };

    for(unsigned i = 0; i < thread_count; ++i)
        threads[i] = std::thread(invoke, i);

    for(auto& i : threads)
        i.join();

    auto& frequencies = hash_tables[0];
    for(unsigned i = 1 ; i < thread_count; ++i)
        for(auto& j : hash_tables[i])
            frequencies[j.first] += j.second;

    // return the 'frequency' by move instead of copy.
    return std::move(frequencies);
}